

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

void __thiscall
flecs::_::column_args<Position,Rocket>::populate_columns<Position*,Rocket*>
          (column_args<Position,Rocket> *this,ecs_iter_t *iter,size_t index,Position *comp,
          Rocket *comps)

{
  _Bool _Var1;
  int column_00;
  void *pvVar2;
  reference pvVar3;
  bool local_41;
  void *ptr;
  int32_t column;
  Rocket *comps_local;
  Position *comp_local;
  size_t index_local;
  ecs_iter_t *iter_local;
  column_args<Position,_Rocket> *this_local;
  
  column_00 = (int)index + 1;
  pvVar2 = ecs_column_w_size(iter,8,column_00);
  pvVar3 = std::array<flecs::_::column_args<Position,_Rocket>::Column,_2UL>::operator[]
                     ((array<flecs::_::column_args<Position,_Rocket>::Column,_2UL> *)this,index);
  pvVar3->ptr = pvVar2;
  _Var1 = ecs_is_owned(iter,column_00);
  local_41 = !_Var1 && pvVar2 != (void *)0x0;
  pvVar3 = std::array<flecs::_::column_args<Position,_Rocket>::Column,_2UL>::operator[]
                     ((array<flecs::_::column_args<Position,_Rocket>::Column,_2UL> *)this,index);
  pvVar3->is_shared = local_41;
  populate_columns<Rocket*>(this,iter,index + 1,comps);
  return;
}

Assistant:

void populate_columns(ecs_iter_t *iter, size_t index, T comp, Targs... comps) {
        int32_t column = static_cast<int32_t>(index + 1);
        void *ptr = ecs_column_w_size(iter, sizeof(*comp), column);
        m_columns[index].ptr = ptr;
        m_columns[index].is_shared = !ecs_is_owned(iter, column) && ptr != nullptr;
        populate_columns(iter, index + 1, comps ...);
    }